

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintSExpression::handleSignature
          (PrintSExpression *this,Function *curr,bool printImplicitNames)

{
  HeapType *this_00;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  Type *pTVar5;
  undefined7 in_register_00000011;
  Index index;
  undefined1 auVar6 [8];
  Signature SVar7;
  Iterator IVar8;
  string_view str;
  string_view str_00;
  string_view str_01;
  RecGroup local_68;
  Type *local_60;
  Function *local_58;
  HeapType *local_50;
  undefined4 local_44;
  undefined1 local_40 [8];
  Iterator __begin1;
  
  local_44 = (undefined4)CONCAT71(in_register_00000011,printImplicitNames);
  std::operator<<(this->o,'(');
  str._M_str = "func ";
  str._M_len = 5;
  printMajor(this->o,str);
  Name::print((Name *)curr,this->o);
  if ((this->currModule == (Module *)0x0) || (((this->currModule->features).features & 0x400) == 0))
  {
    local_40 = (undefined1  [8])(curr->type).id;
    bVar1 = HeapType::isOpen((HeapType *)local_40);
    if ((!bVar1) && (bVar1 = HeapType::isShared((HeapType *)local_40), !bVar1)) {
      local_68 = HeapType::getRecGroup((HeapType *)local_40);
      sVar3 = RecGroup::size(&local_68);
      if (sVar3 < 2) goto LAB_00b1a550;
    }
  }
  std::operator<<(this->o," (type ");
  poVar4 = printHeapTypeName(this,(HeapType)(curr->type).id);
  std::operator<<(poVar4,')');
LAB_00b1a550:
  local_50 = &curr->type;
  local_58 = curr;
  SVar7 = HeapType::getSignature(local_50);
  local_68.id = (uintptr_t)SVar7.params.id;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_40 = (undefined1  [8])&local_68;
  IVar8 = wasm::Type::end((Type *)&local_68);
  local_60 = IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
  pTVar5 = (Type *)0x0;
  index = 0;
  bVar1 = false;
  auVar6 = (undefined1  [8])&local_68;
  while ((pTVar5 != (Type *)IVar8.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index || (auVar6 != (undefined1  [8])local_60))) {
    pTVar5 = wasm::Type::Iterator::operator*((Iterator *)local_40);
    if (((char)local_44 != '\0') || (bVar2 = Function::hasLocalName(local_58,index), bVar2)) {
      poVar4 = this->o;
      if (bVar1) {
        poVar4 = std::operator<<(poVar4,')');
      }
      std::operator<<(poVar4,this->maybeSpace);
      std::operator<<(this->o,'(');
      str_00._M_str = "param ";
      str_00._M_len = 6;
      printMinor(this->o,str_00);
      anon_unknown_0::printLocal(index,this->currFunction,this->o);
      std::operator<<(this->o,' ');
      printType(this,(Type)pTVar5->id);
      std::operator<<(this->o,')');
      bVar1 = false;
    }
    else {
      if (bVar1) {
        std::operator<<(this->o,' ');
      }
      else {
        std::operator<<(this->o,this->maybeSpace);
        std::operator<<(this->o,'(');
        str_01._M_str = "param ";
        str_01._M_len = 6;
        printMinor(this->o,str_01);
        bVar1 = true;
      }
      printType(this,(Type)pTVar5->id);
    }
    index = index + 1;
    pTVar5 = (Type *)((long)&(__begin1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
    auVar6 = local_40;
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar5;
  }
  if (bVar1) {
    std::operator<<(this->o,')');
  }
  this_00 = local_50;
  SVar7 = HeapType::getSignature(local_50);
  if (SVar7.results.id.id != 0) {
    std::operator<<(this->o,this->maybeSpace);
    SVar7 = HeapType::getSignature(this_00);
    printResultType(this,SVar7.results.id);
  }
  return;
}

Assistant:

void PrintSExpression::handleSignature(Function* curr,
                                       bool printImplicitNames) {
  o << '(';
  printMajor(o, "func ");
  curr->name.print(o);
  if ((currModule && currModule->features.hasGC()) ||
      requiresExplicitFuncType(curr->type)) {
    o << " (type ";
    printHeapTypeName(curr->type) << ')';
  }
  bool inParam = false;
  Index i = 0;
  for (const auto& param : curr->getParams()) {
    auto hasName = printImplicitNames || curr->hasLocalName(i);
    if (hasName && inParam) {
      o << ')' << maybeSpace;
      inParam = false;
    } else if (inParam) {
      o << ' ';
    } else {
      o << maybeSpace;
    }
    if (!inParam) {
      o << '(';
      printMinor(o, "param ");
      inParam = true;
    }
    if (hasName) {
      printLocal(i, currFunction, o);
      o << ' ';
    }
    printType(param);
    if (hasName) {
      o << ')';
      inParam = false;
    }
    ++i;
  }
  if (inParam) {
    o << ')';
  }
  if (curr->getResults() != Type::none) {
    o << maybeSpace;
    printResultType(curr->getResults());
  }
}